

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

attr_list decode_attr_from_xmit(void *buf)

{
  size_t __n;
  char cVar1;
  undefined2 uVar2;
  int iVar3;
  int_attr_struct *__dest;
  attr_p paVar4;
  ssize_t sVar5;
  ushort uVar6;
  ushort uVar7;
  attr_list p_Var8;
  ulong uVar9;
  void *__dest_00;
  attr_union *paVar10;
  ssize_t *psVar11;
  char tmp;
  uint uVar12;
  undefined4 uVar13;
  attr_union *buf_00;
  ssize_t *psVar14;
  
  __n = (ulong)*(byte *)((long)buf + 1) * 8 + 4;
  p_Var8 = internal_create_attr_list((uint)*(byte *)((long)buf + 1),(uint)*(byte *)((long)buf + 2));
  cVar1 = *buf;
  if (words_bigendian == '\0') {
    words_bigendian = '\x01';
  }
  __dest = (p_Var8->l).list.iattrs;
  memcpy(__dest,buf,__n);
  __dest->byte_order = '\0';
  if ((cVar1 != '\0') && (*(char *)((long)buf + 1) != '\0')) {
    uVar9 = 0;
    do {
      uVar2 = *(undefined2 *)((long)&__dest->iattr[uVar9].attr_id + 2);
      uVar7 = (ushort)__dest->iattr[uVar9].attr_id;
      uVar6 = (ushort)__dest->iattr[uVar9].value;
      *(ushort *)((long)&__dest->iattr[uVar9].attr_id + 2) = uVar7 << 8 | uVar7 >> 8;
      *(char *)&__dest->iattr[uVar9].attr_id = (char)((ushort)uVar2 >> 8);
      *(char *)((long)&__dest->iattr[uVar9].attr_id + 1) = (char)uVar2;
      uVar2 = *(undefined2 *)((long)&__dest->iattr[uVar9].value + 2);
      *(ushort *)((long)&__dest->iattr[uVar9].value + 2) = uVar6 << 8 | uVar6 >> 8;
      *(char *)&__dest->iattr[uVar9].value = (char)((ushort)uVar2 >> 8);
      *(char *)((long)&__dest->iattr[uVar9].value + 1) = (char)uVar2;
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(byte *)((long)buf + 1));
  }
  if (*(char *)((long)buf + 2) != '\0') {
    paVar4 = (p_Var8->l).list.attributes;
    buf_00 = &paVar4->value;
    uVar9 = 0;
    psVar14 = (ssize_t *)(__n + (long)buf);
    do {
      sVar5 = *psVar14;
      *(ssize_t *)((long)(buf_00 + -1) + 8) = sVar5;
      if (cVar1 == '\0') {
        uVar13 = (undefined4)((ulong)sVar5 >> 0x20);
      }
      else {
        uVar12 = (uint)sVar5;
        *(uint *)((long)(buf_00 + -1) + 8) =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        uVar2 = *(undefined2 *)((long)(buf_00 + -1) + 0xe);
        *(ushort *)((long)(buf_00 + -1) + 0xe) =
             *(ushort *)((long)(buf_00 + -1) + 0xc) << 8 |
             *(ushort *)((long)(buf_00 + -1) + 0xc) >> 8;
        *(char *)((long)(buf_00 + -1) + 0xc) = (char)((ushort)uVar2 >> 8);
        *(char *)((long)(buf_00 + -1) + 0xd) = (char)uVar2;
        uVar13 = *(undefined4 *)((long)(buf_00 + -1) + 0xc);
      }
      psVar11 = psVar14 + 1;
      switch(uVar13) {
      case 0:
      case 1:
      case 7:
      case 9:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x72f,"attr_list decode_attr_from_xmit(void *)");
      case 2:
      case 8:
        (buf_00->u).l = *psVar11;
        if (cVar1 != '\0') {
          byte_swap((char *)buf_00,8);
        }
        psVar11 = psVar14 + 2;
        break;
      case 3:
      case 4:
        uVar7 = *(ushort *)(psVar14 + 1);
        uVar6 = uVar7 >> 8;
        if (cVar1 == '\0') {
          uVar6 = uVar7;
          uVar7 = uVar7 >> 8;
        }
        uVar7 = uVar6 & 0xff | uVar7 << 8;
        iVar3 = *(int *)((long)(buf_00 + -1) + 0xc);
        __dest_00 = malloc((long)(short)uVar7);
        memcpy(__dest_00,(void *)((long)psVar14 + 10),(long)(short)uVar7);
        paVar10 = buf_00;
        if (iVar3 != 3) {
          (buf_00->u).i = (int)(short)uVar7;
          paVar10 = (attr_union *)((long)&paVar4[uVar9].value.u + 8);
        }
        (paVar10->u).p = __dest_00;
        psVar11 = (ssize_t *)
                  ((long)psVar14 + 10 + (long)(int)((int)(short)uVar7 + 5U & 0xfffffffc) + -2);
        break;
      case 5:
        sVar5 = *psVar11;
        (buf_00->u).i = (int)sVar5;
        if (cVar1 != '\0') {
          uVar7 = (ushort)(int)sVar5;
          uVar2 = *(undefined2 *)((long)&buf_00->u + 2);
          *(ushort *)((long)&buf_00->u + 2) = uVar7 << 8 | uVar7 >> 8;
          *(char *)&buf_00->u = (char)((ushort)uVar2 >> 8);
          *(char *)((long)&buf_00->u + 1) = (char)uVar2;
        }
        psVar11 = (ssize_t *)((long)psVar14 + 0xc);
        break;
      case 6:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x756,"attr_list decode_attr_from_xmit(void *)");
      }
      uVar9 = uVar9 + 1;
      buf_00 = (attr_union *)((long)(buf_00 + 1) + 8);
      psVar14 = psVar11;
    } while (uVar9 < *(byte *)((long)buf + 2));
  }
  return p_Var8;
}

Assistant:

extern attr_list
decode_attr_from_xmit(void * buf)
{
    int_attr_p header = (int_attr_p) buf;
    int iattr_size = sizeof(struct int_attr_struct) + 
	(header->int_attr_count -1) * sizeof(int_attr);
    attr_list l = internal_create_attr_list(header->int_attr_count,
					    header->other_attr_count);
    /* byte swap if the encoders byte order is not equal to ours */
    int bswap = header->byte_order != WORDS_BIGENDIAN;
    char *optr = (char*)buf + iattr_size;
    int i;
    
    memcpy(l->l.list.iattrs, buf, iattr_size);
    l->l.list.iattrs->byte_order = WORDS_BIGENDIAN; /* overwrite original */
    if (bswap) {
	for (i=0; i < header->int_attr_count; i++) {
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].value, 4);
	}
    }
    for (i=0; i< header->other_attr_count; i++) {
	memcpy(&l->l.list.attributes[i], optr, 8);
	if (bswap) {
	    byte_swap((char*)&l->l.list.attributes[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.attributes[i].val_type, 4);
	}
	optr += 8;
	switch(l->l.list.attributes[i].val_type) {
	case Attr_Int4:
	case Attr_Undefined:
	case Attr_Float16:
	case Attr_Float4:
	    assert(0);
	    break;
	case Attr_Int8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Float8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Atom:
	    memcpy(&l->l.list.attributes[i].value, optr, 4);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 4);
	    optr += 4;
	    break;
	case Attr_Opaque:
	case Attr_String: {
	    int2 len = *(int2*)optr;
	    int pad_len;
	    if (bswap) byte_swap((char*)&len, 2);
	    pad_len = roundup4(len + 2) - 2;
	    optr += 2;
	    if (l->l.list.attributes[i].val_type == Attr_String) {
		char *value = malloc(len);
		memcpy(value, optr, len);
		l->l.list.attributes[i].value.u.p = value;
	    } else {
		attr_opaque op;
		op.length = len;
		op.buffer = malloc(len);
		memcpy(op.buffer, optr, len);
		l->l.list.attributes[i].value.u.o = op;
	    }
	    optr += pad_len;
	    break;
	  }
	case Attr_List:
	    assert(0);
	    break;
	}
    }
    return l;
}